

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O0

bool Secp256K1::Verify(uint8_t *msgHash,vector<unsigned_char,_std::allocator<unsigned_char>_> *sign,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *pubKey)

{
  int iVar1;
  size_type sVar2;
  Secp256K1Exception *pSVar3;
  secp256k1_context *ctx_00;
  uchar *puVar4;
  undefined1 local_b0 [7];
  bool ret;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  secp256k1_context *ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pubKey_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *sign_local;
  uint8_t *msgHash_local;
  
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pubKey);
  if (sVar2 != 0x41) {
    pSVar3 = (Secp256K1Exception *)__cxa_allocate_exception(0x10);
    Secp256K1Exception::Secp256K1Exception(pSVar3,"Invalid public key size");
    __cxa_throw(pSVar3,&Secp256K1Exception::typeinfo,Secp256K1Exception::~Secp256K1Exception);
  }
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(sign);
  if (sVar2 != 0x48) {
    pSVar3 = (Secp256K1Exception *)__cxa_allocate_exception(0x10);
    Secp256K1Exception::Secp256K1Exception(pSVar3,"Invalid signature size");
    __cxa_throw(pSVar3,&Secp256K1Exception::typeinfo,Secp256K1Exception::~Secp256K1Exception);
  }
  ctx_00 = secp256k1_context_create(0x101);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pubKey);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pubKey);
  iVar1 = secp256k1_ec_pubkey_parse(ctx_00,(secp256k1_pubkey *)(sig.data + 0x38),puVar4,sVar2);
  if (iVar1 == 0) {
    msgHash_local._7_1_ = false;
  }
  else {
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(sign);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(sign);
    iVar1 = secp256k1_ecdsa_signature_parse_der
                      (ctx_00,(secp256k1_ecdsa_signature *)local_b0,puVar4,sVar2);
    if (iVar1 == 0) {
      msgHash_local._7_1_ = false;
    }
    else {
      secp256k1_ecdsa_signature_normalize
                (ctx_00,(secp256k1_ecdsa_signature *)local_b0,(secp256k1_ecdsa_signature *)local_b0)
      ;
      iVar1 = secp256k1_ecdsa_verify
                        (ctx_00,(secp256k1_ecdsa_signature *)local_b0,msgHash,
                         (secp256k1_pubkey *)(sig.data + 0x38));
      msgHash_local._7_1_ = iVar1 != 0;
      secp256k1_context_destroy(ctx_00);
    }
  }
  return msgHash_local._7_1_;
}

Assistant:

bool Secp256K1::Verify(const uint8_t* msgHash, const std::vector<uint8_t> sign, const std::vector<uint8_t> pubKey)
{
    if (pubKey.size() != PUBLIC_KEY_SIZE) {
        throw Secp256K1Exception("Invalid public key size");
    }
    if (sign.size() != 72) {
        throw Secp256K1Exception("Invalid signature size");
    }

    secp256k1_context* ctx = secp256k1_context_create(SECP256K1_CONTEXT_VERIFY);
    // Parse public key.
    secp256k1_pubkey pubkey;
    if (!secp256k1_ec_pubkey_parse(ctx, &pubkey, pubKey.data(),
            pubKey.size())) {
        return false;
    }

    // Parse signature.
    secp256k1_ecdsa_signature sig;
    if (secp256k1_ecdsa_signature_parse_der(ctx, &sig, sign.data(), sign.size()) == 0) {
        return false;
    }
    //    if (!ecdsa_signature_parse_der_lax(ctx, &sig, sig_in.data(),
    //            sig_in.size())) {
    //        return false;
    //    }

    secp256k1_ecdsa_signature_normalize(ctx, &sig, &sig);
    bool ret = secp256k1_ecdsa_verify(ctx, &sig, msgHash, &pubkey);
    secp256k1_context_destroy(ctx);
    return ret;
}